

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

int archive_write_zip_finish_entry(archive_write *a)

{
  z_stream *pzVar1;
  zip_conflict *zip;
  int64_t iVar2;
  long lVar3;
  int iVar4;
  undefined1 *puVar5;
  uchar *puVar6;
  long lVar7;
  undefined1 uVar8;
  uchar *p;
  size_t sVar9;
  uchar *p_1;
  long *plVar10;
  uchar zip64 [32];
  undefined4 local_48;
  undefined8 local_44;
  undefined1 local_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31 [9];
  
  zip = (zip_conflict *)a->format_data;
  if (zip->entry_compression == COMPRESSION_DEFLATE) {
    pzVar1 = &zip->stream;
    iVar4 = deflate(pzVar1,4);
    while( true ) {
      if (iVar4 == -2) {
        return -0x1e;
      }
      sVar9 = zip->len_buf - (ulong)(zip->stream).avail_out;
      iVar4 = __archive_write_output(a,zip->buf,sVar9);
      if (iVar4 != 0) {
        return iVar4;
      }
      zip->entry_compressed_written = zip->entry_compressed_written + sVar9;
      zip->written_bytes = zip->written_bytes + sVar9;
      (zip->stream).next_out = zip->buf;
      if ((zip->stream).avail_out != 0) break;
      (zip->stream).avail_out = (uInt)zip->len_buf;
      iVar4 = deflate(pzVar1,4);
    }
    deflateEnd(pzVar1);
  }
  if ((zip->entry_flags & 8) != 0) {
    local_48 = 0x8074b50;
    iVar2 = zip->entry_compressed_written;
    local_44 = CONCAT44((int)iVar2,zip->entry_crc32);
    if (zip->entry_uses_zip64 == 0) {
      puVar5 = &uStack_39;
      iVar2 = zip->entry_uncompressed_written;
      local_3c = (undefined1)iVar2;
      uStack_3b = (undefined1)((ulong)iVar2 >> 8);
      uStack_3a = (undefined1)((ulong)iVar2 >> 0x10);
      uVar8 = (undefined1)((ulong)iVar2 >> 0x18);
      sVar9 = 0x10;
    }
    else {
      puVar5 = local_31;
      local_3c = (undefined1)((ulong)iVar2 >> 0x20);
      uStack_3b = (undefined1)((ulong)iVar2 >> 0x28);
      uStack_3a = (undefined1)((ulong)iVar2 >> 0x30);
      uStack_39 = (undefined1)((ulong)iVar2 >> 0x38);
      iVar2 = zip->entry_uncompressed_written;
      uStack_38 = (undefined1)iVar2;
      uStack_37 = (undefined1)((ulong)iVar2 >> 8);
      uStack_36 = (undefined1)((ulong)iVar2 >> 0x10);
      uStack_35 = (undefined1)((ulong)iVar2 >> 0x18);
      local_34 = (undefined1)((ulong)iVar2 >> 0x20);
      local_33 = (undefined1)((ulong)iVar2 >> 0x28);
      local_32 = (undefined1)((ulong)iVar2 >> 0x30);
      uVar8 = (undefined1)((ulong)iVar2 >> 0x38);
      sVar9 = 0x18;
    }
    *puVar5 = uVar8;
    iVar4 = __archive_write_output(a,&local_48,sVar9);
    zip->written_bytes = zip->written_bytes + sVar9;
    if (iVar4 != 0) {
      return -0x1e;
    }
  }
  lVar7 = zip->entry_compressed_written;
  lVar3 = zip->entry_uncompressed_written;
  if (lVar7 < 0x100000000) {
    if (lVar3 < 0x100000000) {
      if (zip->entry_offset < 0x100000000) goto LAB_00236590;
      goto LAB_002364d1;
    }
LAB_00236506:
    plVar10 = (long *)&local_3c;
    local_44 = lVar3;
  }
  else {
LAB_002364d1:
    plVar10 = &local_44;
    if (0xfffffffe < lVar3) goto LAB_00236506;
  }
  if (0xfffffffe < lVar7) {
    *plVar10 = lVar7;
    plVar10 = plVar10 + 1;
  }
  if (0xfffffffe < zip->entry_offset) {
    *plVar10 = zip->entry_offset;
    plVar10 = plVar10 + 1;
  }
  local_48 = CONCAT22((short)plVar10 - (short)&local_44,1);
  puVar6 = cd_alloc(zip,(long)plVar10 - (long)&local_48);
  if (puVar6 == (uchar *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
    return -0x1e;
  }
  memcpy(puVar6,&local_48,(long)plVar10 - (long)&local_48);
  puVar6 = zip->file_header;
  if (*(ushort *)(puVar6 + 6) < 0x2d) {
    puVar6[6] = '-';
    puVar6[7] = '\0';
  }
LAB_00236590:
  *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  lVar7 = zip->entry_compressed_written;
  if (0xfffffffe < lVar7) {
    lVar7 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar7;
  lVar7 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar7) {
    lVar7 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar7;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar7 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar7 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar7;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;
			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8, (uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16, (uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8, (uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12, (uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > 0xffffffffLL
	    || zip->entry_uncompressed_written > 0xffffffffLL
	    || zip->entry_offset > 0xffffffffLL) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= 0xffffffffLL) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= 0xffffffffLL) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= 0xffffffffLL) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, z - (zip64 + 4));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
	    zipmin(zip->entry_compressed_written, 0xffffffffLL));
	archive_le32enc(zip->file_header + 24,
	    zipmin(zip->entry_uncompressed_written, 0xffffffffLL));
	archive_le16enc(zip->file_header + 30,
	    zip->central_directory_bytes - zip->file_header_extra_offset);
	archive_le32enc(zip->file_header + 42,
	    zipmin(zip->entry_offset, 0xffffffffLL));

	return (ARCHIVE_OK);
}